

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool SparseKeyTest<9992,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  Blob<256> h;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_558;
  value_type local_538;
  Blob<9992> local_511;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2708,pcVar2,(ulong)(uint)setbits
        );
  local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&local_511,0,0x4e1);
  if (iVar3 != 0) {
    local_538.bytes[0] = '\0';
    local_538.bytes[1] = '\0';
    local_538.bytes[2] = '\0';
    local_538.bytes[3] = '\0';
    local_538.bytes[4] = '\0';
    local_538.bytes[5] = '\0';
    local_538.bytes[6] = '\0';
    local_538.bytes[7] = '\0';
    local_538.bytes[8] = '\0';
    local_538.bytes[9] = '\0';
    local_538.bytes[10] = '\0';
    local_538.bytes[0xb] = '\0';
    local_538.bytes[0xc] = '\0';
    local_538.bytes[0xd] = '\0';
    local_538.bytes[0xe] = '\0';
    local_538.bytes[0xf] = '\0';
    local_538.bytes[0x10] = '\0';
    local_538.bytes[0x11] = '\0';
    local_538.bytes[0x12] = '\0';
    local_538.bytes[0x13] = '\0';
    local_538.bytes[0x14] = '\0';
    local_538.bytes[0x15] = '\0';
    local_538.bytes[0x16] = '\0';
    local_538.bytes[0x17] = '\0';
    local_538.bytes[0x18] = '\0';
    local_538.bytes[0x19] = '\0';
    local_538.bytes[0x1a] = '\0';
    local_538.bytes[0x1b] = '\0';
    local_538.bytes[0x1c] = '\0';
    local_538.bytes[0x1d] = '\0';
    local_538.bytes[0x1e] = '\0';
    local_538.bytes[0x1f] = '\0';
    (*hash.m_hash)(&local_511,0x4e1,0,&local_538);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(&local_558,&local_538);
  }
  SparseKeygenRecurse<Blob<9992>,Blob<256>>(hash.m_hash,0,setbits,inclusive,&local_511,&local_558);
  printf("%d keys\n",
         (ulong)((long)local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 5);
  bVar1 = TestHashList<Blob<256>>(&local_558,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}